

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

void __thiscall
QAbstractFileEngineHandlerList::~QAbstractFileEngineHandlerList
          (QAbstractFileEngineHandlerList *this)

{
  Type *pTVar1;
  long in_FS_OFFSET;
  QWriteLocker locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
  *in_stack_ffffffffffffffd8;
  QWriteLocker *this_00;
  QWriteLocker local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (QWriteLocker)0xaa;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
           ::operator()(in_stack_ffffffffffffffd8);
  this_00 = &local_9;
  QWriteLocker::QWriteLocker(this_00,pTVar1);
  qt_abstractfileenginehandlerlist_shutDown = true;
  QWriteLocker::~QWriteLocker(this_00);
  QList<QAbstractFileEngineHandler_*>::~QList((QList<QAbstractFileEngineHandler_*> *)0x192771);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~QAbstractFileEngineHandlerList()
    {
        QWriteLocker locker(fileEngineHandlerMutex());
        qt_abstractfileenginehandlerlist_shutDown = true;
    }